

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::BaseTriangleTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BaseTriangleTestInstance *this)

{
  size_type *psVar1;
  ulong uVar2;
  deUint32 width;
  size_t **ppsVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  pointer pVVar11;
  ulong *puVar12;
  ulong uVar13;
  Surface resultImage;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  string iterationDescription;
  ScopedLogSection section;
  RasterizationArguments args;
  IVec4 colorBits;
  TriangleSceneSpec scene;
  Surface local_268;
  long lStack_250;
  pointer local_248;
  pointer pSStack_240;
  pointer local_238 [2];
  undefined1 local_228 [24];
  long lStack_210;
  string local_200;
  ScopedLogSection local_1e0;
  RasterizationArguments local_1d8;
  undefined4 uStack_1c4;
  int local_1b8 [4];
  undefined1 local_1a8 [112];
  ios_base local_138 [272];
  
  iVar8 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,iVar8 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0xb4db6c);
  pVVar11 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pVVar11) {
    local_228._16_8_ = *(undefined8 *)pVVar11->m_data;
    lStack_210 = plVar9[3];
    local_228._0_8_ = (pointer)(local_228 + 0x10);
  }
  else {
    local_228._16_8_ = *(undefined8 *)pVVar11->m_data;
    local_228._0_8_ = (pointer)*plVar9;
  }
  local_228._8_8_ = plVar9[1];
  *plVar9 = (long)pVVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_228);
  ppsVar3 = (size_t **)&local_268.m_pixels.m_cap;
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_268.m_pixels.m_cap = *puVar12;
    lStack_250 = plVar9[3];
    local_268._0_8_ = ppsVar3;
  }
  else {
    local_268.m_pixels.m_cap = *puVar12;
    local_268._0_8_ = (ulong *)*plVar9;
  }
  local_268.m_pixels.m_ptr = (void *)plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar2 = CONCAT44(local_1d8.greenBits,local_1d8.redBits) + (long)local_268.m_pixels.m_ptr;
  uVar13 = 0xf;
  if ((size_t **)local_268._0_8_ != ppsVar3) {
    uVar13 = local_268.m_pixels.m_cap;
  }
  if (uVar13 < uVar2) {
    uVar13 = 0xf;
    if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
      uVar13 = CONCAT44(uStack_1c4,local_1d8.blueBits);
    }
    if (uVar2 <= uVar13) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_268._0_8_);
      goto LAB_007b7c05;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&local_268,CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples));
LAB_007b7c05:
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200.field_2._8_8_ = puVar10[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_200._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
    operator_delete((undefined1 *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples),
                    CONCAT44(uStack_1c4,local_1d8.blueBits) + 1);
  }
  if ((size_t **)local_268._0_8_ != ppsVar3) {
    operator_delete((void *)local_268._0_8_,local_268.m_pixels.m_cap + 1);
  }
  if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)((long)(float *)local_228._16_8_ + 1));
  }
  if (local_248 != (pointer)local_238) {
    operator_delete(local_248,(long)local_238[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1e0,
             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
             m_log,&local_200,&local_200);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&local_268,width,width);
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_228._16_8_ = (pointer)0x0;
  local_238[0] = (pointer)0x0;
  local_248 = (pointer)0x0;
  pSStack_240 = (pointer)0x0;
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[7])
            (this,(ulong)(uint)this->m_iteration);
  BaseRenderingTestInstance::drawPrimitives
            (&this->super_BaseRenderingTestInstance,&local_268,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,
             this->m_primitiveTopology);
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_1a8._16_8_ = (pointer)0x0;
  tcu::getTextureFormatBitDepth
            ((tcu *)local_1b8,&(this->super_BaseRenderingTestInstance).m_textureFormat);
  uVar6 = local_1a8._16_8_;
  uVar5 = local_1a8._8_8_;
  uVar4 = local_1a8._0_8_;
  local_1d8.numSamples = (int)((this->super_BaseRenderingTestInstance).m_multisampling != 0);
  local_1d8.subpixelBits = (this->super_BaseRenderingTestInstance).m_subpixelBits;
  local_1d8.redBits = local_1b8[0];
  local_1d8.greenBits = (int)local_1b8._4_8_;
  local_1d8.blueBits = SUB84(local_1b8._4_8_,4);
  local_1a8._0_8_ = local_248;
  local_1a8._8_8_ = pSStack_240;
  local_1a8._16_8_ = local_238[0];
  local_248 = (pointer)uVar4;
  pSStack_240 = (pointer)uVar5;
  local_238[0] = (pointer)uVar6;
  bVar7 = tcu::verifyTriangleGroupRasterization
                    (&local_268,(TriangleSceneSpec *)local_1a8,&local_1d8,
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                     m_testCtx->m_log,VERIFICATIONMODE_STRICT);
  if (!bVar7) {
    this->m_allIterationsPassed = false;
  }
  if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ - local_1a8._0_8_);
  }
  iVar8 = this->m_iteration + 1;
  this->m_iteration = iVar8;
  if (iVar8 == this->m_iterationCount) {
    if (this->m_allIterationsPassed == true) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Pass","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1a8._0_8_,
                 (undefined1 *)((long)((Vec4 *)local_1a8._8_8_)->m_data + local_1a8._0_8_));
    }
    else {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Incorrect rasterization","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1a8._0_8_,
                 (undefined1 *)((long)((Vec4 *)local_1a8._8_8_)->m_data + local_1a8._0_8_));
    }
    if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)((long)((Vec4 *)local_1a8._16_8_)->m_data + 1))
      ;
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  if (local_248 != (pointer)0x0) {
    operator_delete(local_248,(long)local_238[0] - (long)local_248);
  }
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
  }
  tcu::Surface::~Surface(&local_268);
  tcu::TestLog::endSection(local_1e0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BaseTriangleTestInstance::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	generateTriangles(m_iteration, drawBuffer, triangles);

	// draw image
	drawPrimitives(resultImage, drawBuffer, m_primitiveTopology);

	// compare
	{
		bool					compareOk;
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

		args.numSamples		= m_multisampling ? 1 : 0;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= colorBits[0];
		args.greenBits		= colorBits[1];
		args.blueBits		= colorBits[2];

		scene.triangles.swap(triangles);

		compareOk = verifyTriangleGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());

		if (!compareOk)
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}